

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerSafe::SetPendingDataset
          (CommissionerSafe *this,ErrorHandler *aHandler,PendingOperationalDataset *aDataset)

{
  _func_void *p_Var1;
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  CommissionerSafe *local_130;
  _Any_data local_128;
  long local_118;
  undefined8 uStack_110;
  undefined1 local_108 [220];
  undefined4 local_2c;
  
  local_130 = this;
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_128,aHandler);
  ActiveOperationalDataset::ActiveOperationalDataset
            ((ActiveOperationalDataset *)local_108,&aDataset->super_ActiveOperationalDataset);
  local_2c = *(undefined4 *)&(aDataset->mPendingTimestamp).field_0x4;
  local_108._212_8_ = *(undefined8 *)&(aDataset->super_ActiveOperationalDataset).field_0xd4;
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_148 = (code *)0x0;
  pcStack_140 = (code *)0x0;
  p_Var1 = (_func_void *)operator_new(0x108);
  *(CommissionerSafe **)p_Var1 = local_130;
  *(undefined8 *)(p_Var1 + 8) = 0;
  *(undefined8 *)(p_Var1 + 0x10) = 0;
  *(undefined8 *)(p_Var1 + 0x18) = 0;
  *(undefined8 *)(p_Var1 + 0x20) = uStack_110;
  if (local_118 != 0) {
    *(void **)(p_Var1 + 8) = local_128._M_unused._M_object;
    *(undefined8 *)(p_Var1 + 0x10) = local_128._8_8_;
    *(long *)(p_Var1 + 0x18) = local_118;
    local_118 = 0;
    uStack_110 = 0;
  }
  ActiveOperationalDataset::ActiveOperationalDataset
            ((ActiveOperationalDataset *)(p_Var1 + 0x28),(ActiveOperationalDataset *)local_108);
  *(undefined4 *)(p_Var1 + 0x104) = local_2c;
  *(undefined8 *)(p_Var1 + 0xfc) = local_108._212_8_;
  pcStack_140 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:369:22)>
                ::_M_invoke;
  local_148 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:369:22)>
              ::_M_manager;
  local_158._M_unused._0_8_ = (undefined8)p_Var1;
  PushAsyncRequest(this,(AsyncRequest *)&local_158);
  if (local_148 != (code *)0x0) {
    (*local_148)(&local_158,&local_158,__destroy_functor);
  }
  SetPendingDataset(std::function<void(ot::commissioner::Error)>,ot::commissioner::PendingOperationalDataset_const&)
  ::$_0::~__0((__0 *)&local_130);
  return;
}

Assistant:

void CommissionerSafe::SetPendingDataset(ErrorHandler aHandler, const PendingOperationalDataset &aDataset)
{
    PushAsyncRequest([=]() { mImpl->SetPendingDataset(aHandler, aDataset); });
}